

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

size_t defaultPrevCharLen(char *buf,size_t param_2,size_t pos,size_t *col_len)

{
  bool bVar1;
  int iVar2;
  long *in_RCX;
  long in_RDX;
  char *in_RDI;
  int cp;
  size_t len;
  size_t end;
  int local_3c;
  size_t local_38;
  long local_30;
  long *local_28;
  long local_20;
  char *local_10;
  
  local_30 = in_RDX;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  do {
    if (local_20 == 0) {
      return 0;
    }
    local_38 = prevUtf8CodePointLen(local_10,(int)local_20);
    local_20 = local_20 - local_38;
    utf8BytesToCodePoint(local_10 + local_20,local_38,&local_3c);
    bVar1 = isCombiningChar((long)local_3c);
  } while (bVar1);
  if (local_28 != (long *)0x0) {
    bVar1 = isWideChar((long)local_3c);
    iVar2 = 1;
    if (bVar1) {
      iVar2 = 2;
    }
    *local_28 = (long)iVar2;
  }
  return local_30 - local_20;
}

Assistant:

static size_t defaultPrevCharLen(const char * buf, size_t /*buf_len*/, size_t pos, size_t * col_len) {
    size_t end = pos;
    while (pos > 0) {
        size_t len = prevUtf8CodePointLen(buf, pos);
        pos -= len;
        int cp;
        utf8BytesToCodePoint(buf + pos, len, &cp);
        if (!isCombiningChar(cp)) {
            if (col_len != NULL) {
                *col_len = isWideChar(cp) ? 2 : 1;
            }
            return end - pos;
        }
    }
    /* NOTREACHED */
    return 0;
}